

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O0

void encode_mv_component(aom_writer *w,int comp,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  byte bVar1;
  uint uVar2;
  aom_cdf_prob *cdf;
  char in_CL;
  long in_RDX;
  undefined8 in_RDI;
  int n;
  int i;
  int hp;
  int fr;
  int d;
  int mv_class;
  int mag;
  int sign;
  int offset;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  aom_cdf_prob *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  int symb;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_3c;
  undefined4 local_20;
  
  bVar1 = av1_get_mv_class((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                           (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  uVar2 = (uint)bVar1;
  aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff8c);
  aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff8c);
  symb = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (uVar2 == 0) {
    aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     symb,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  else {
    for (local_3c = 0; symb = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20), local_3c < (int)uVar2
        ; local_3c = local_3c + 1) {
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       symb,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
  }
  if (-1 < in_CL) {
    aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     symb,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  if ('\0' < in_CL) {
    if (uVar2 == 0) {
      cdf = (aom_cdf_prob *)(in_RDX + 0x3c);
    }
    else {
      cdf = (aom_cdf_prob *)(in_RDX + 0x42);
    }
    aom_write_symbol((aom_writer *)(CONCAT44(local_20,in_stack_ffffffffffffffa0) & 0x1ffffffff),
                     (int)((ulong)in_RDI >> 0x20),cdf,in_stack_ffffffffffffff8c);
  }
  return;
}

Assistant:

static void encode_mv_component(aom_writer *w, int comp, nmv_component *mvcomp,
                                MvSubpelPrecision precision) {
  assert(comp != 0);
  int offset;
  const int sign = comp < 0;
  const int mag = sign ? -comp : comp;
  const int mv_class = av1_get_mv_class(mag - 1, &offset);
  const int d = offset >> 3;         // int mv data
  const int fr = (offset >> 1) & 3;  // fractional mv data
  const int hp = offset & 1;         // high precision mv data

  // Sign
  aom_write_symbol(w, sign, mvcomp->sign_cdf, 2);

  // Class
  aom_write_symbol(w, mv_class, mvcomp->classes_cdf, MV_CLASSES);

  // Integer bits
  if (mv_class == MV_CLASS_0) {
    aom_write_symbol(w, d, mvcomp->class0_cdf, CLASS0_SIZE);
  } else {
    int i;
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    for (i = 0; i < n; ++i)
      aom_write_symbol(w, (d >> i) & 1, mvcomp->bits_cdf[i], 2);
  }
  // Fractional bits
  if (precision > MV_SUBPEL_NONE) {
    aom_write_symbol(
        w, fr,
        mv_class == MV_CLASS_0 ? mvcomp->class0_fp_cdf[d] : mvcomp->fp_cdf,
        MV_FP_SIZE);
  }

  // High precision bit
  if (precision > MV_SUBPEL_LOW_PRECISION)
    aom_write_symbol(
        w, hp, mv_class == MV_CLASS_0 ? mvcomp->class0_hp_cdf : mvcomp->hp_cdf,
        2);
}